

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

bool __thiscall
unodb::
olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::iterator::try_push
          (iterator *this,olc_node_ptr node,byte key_byte,uint8_t child_index,
          key_prefix_snapshot prefix,read_critical_section *rcs)

{
  node_type nVar1;
  key_view v;
  key_prefix_snapshot local_50;
  byte local_48;
  uint8_t local_47;
  iterator *local_40;
  version_tag_type local_38;
  read_critical_section *local_30;
  read_critical_section *rcs_local;
  uint8_t child_index_local;
  iterator *piStack_20;
  byte key_byte_local;
  iterator *this_local;
  key_prefix_snapshot prefix_local;
  olc_node_ptr node_local;
  
  local_30 = rcs;
  rcs_local._6_1_ = child_index;
  rcs_local._7_1_ = key_byte;
  piStack_20 = this;
  this_local = (iterator *)prefix;
  prefix_local = (key_prefix_snapshot)node.tagged_ptr;
  nVar1 = detail::basic_node_ptr<unodb::detail::olc_node_header>::type
                    ((basic_node_ptr<unodb::detail::olc_node_header> *)&prefix_local.f);
  if (nVar1 != LEAF) {
    local_50 = prefix_local;
    local_48 = rcs_local._7_1_;
    local_47 = rcs_local._6_1_;
    local_40 = this_local;
    local_38 = optimistic_lock::read_critical_section::get(local_30);
    std::
    stack<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::deque<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>_>
    ::push(&this->stack_,(value_type *)&local_50.f);
    v = detail::key_prefix_snapshot::get_key_view((key_prefix_snapshot *)&this_local);
    detail::key_buffer::push(&this->keybuf_,v);
    detail::key_buffer::push(&this->keybuf_,rcs_local._7_1_);
    return true;
  }
  __assert_fail("node.type() != node_type::LEAF",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                ,0x1bd,
                "bool unodb::olc_db<std::span<const std::byte>, std::span<const std::byte>>::iterator::try_push(detail::olc_node_ptr, std::byte, std::uint8_t, detail::key_prefix_snapshot, const optimistic_lock::read_critical_section &) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
               );
}

Assistant:

bool try_push(detail::olc_node_ptr node, std::byte key_byte,
                  std::uint8_t child_index, detail::key_prefix_snapshot prefix,
                  const optimistic_lock::read_critical_section& rcs) {
      // For variable length keys we need to know the number of bytes
      // associated with the node's key_prefix.  In addition there is
      // one byte for the descent to the child node along the
      // child_index.  That information needs to be stored on the
      // stack so we can pop off the right number of bytes even for
      // OLC where the node might be concurrently modified.
      UNODB_DETAIL_ASSERT(node.type() != node_type::LEAF);
      stack_.push({{node, key_byte, child_index, prefix}, rcs.get()});
      keybuf_.push(prefix.get_key_view());
      keybuf_.push(key_byte);
      return true;
    }